

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_h_predictor_16x16_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined8 uVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ushort uVar6;
  undefined8 *in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  undefined1 auVar11 [16];
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  __m128i round;
  __m128i scaled_top_right2;
  __m128i scaled_top_right1;
  __m128i inverted_weights2;
  __m128i inverted_weights1;
  __m128i weights2;
  __m128i weights1;
  __m128i scale;
  __m128i weights;
  __m128i top_right;
  __m128i pred2_1;
  __m128i pred1_1;
  __m128i pred_sum2_1;
  __m128i pred_sum1_1;
  __m128i weighted_px2_1;
  __m128i weighted_px1_1;
  __m128i pred2;
  __m128i pred1;
  __m128i pred_sum2;
  __m128i pred_sum1;
  __m128i weighted_px2;
  __m128i weighted_px1;
  int local_84c;
  int local_81c;
  undefined8 *local_748;
  byte local_6c8;
  undefined1 uStack_6c7;
  undefined1 uStack_6c6;
  undefined1 uStack_6c5;
  byte bStack_6c4;
  undefined1 uStack_6c3;
  undefined1 uStack_6c2;
  undefined1 uStack_6c1;
  byte local_688;
  undefined1 uStack_687;
  undefined1 uStack_686;
  undefined1 uStack_685;
  byte bStack_684;
  undefined1 uStack_683;
  undefined1 uStack_682;
  undefined1 uStack_681;
  ushort uStack_5b2;
  ushort uStack_5aa;
  ushort uStack_596;
  ushort uStack_594;
  ushort uStack_592;
  ushort uStack_58e;
  ushort uStack_58c;
  ushort uStack_58a;
  short local_378;
  short sStack_376;
  short sStack_374;
  short sStack_372;
  short sStack_370;
  short sStack_36e;
  short sStack_36c;
  short sStack_36a;
  short local_1b8;
  short sStack_1b6;
  short sStack_1b4;
  short sStack_1b2;
  short sStack_1b0;
  short sStack_1ae;
  short sStack_1ac;
  short sStack_1aa;
  __m128i left_y_1;
  __m128i y_select_1;
  int y_mask_1;
  __m128i left_y;
  __m128i y_select;
  int y_mask;
  __m128i left;
  
  bVar2 = *(byte *)(in_RDX + 0xf);
  uVar6 = (ushort)bVar2;
  uStack_596 = (ushort)bVar2;
  uStack_594 = (ushort)bVar2;
  uStack_592 = (ushort)bVar2;
  uStack_58e = (ushort)bVar2;
  uStack_58c = (ushort)bVar2;
  uStack_58a = (ushort)bVar2;
  uStack_5b2 = (ushort)bVar2;
  uStack_5aa = (ushort)bVar2;
  uVar1 = *in_RCX;
  local_688 = (byte)uVar1;
  uStack_687 = (undefined1)((ulong)uVar1 >> 8);
  uStack_686 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_685 = (undefined1)((ulong)uVar1 >> 0x18);
  bStack_684 = (byte)((ulong)uVar1 >> 0x20);
  uStack_683 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_682 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_681 = (undefined1)((ulong)uVar1 >> 0x38);
  local_748 = in_RDI;
  for (local_81c = 0x1000100; local_81c < 0xf0e0f0f; local_81c = local_81c + 0x2020202) {
    auVar4._4_4_ = local_81c;
    auVar4._0_4_ = local_81c;
    auVar4._12_4_ = local_81c;
    auVar4._8_4_ = local_81c;
    auVar5[1] = 0;
    auVar5[0] = local_688;
    auVar5[2] = uStack_687;
    auVar5[3] = 0;
    auVar5[4] = uStack_686;
    auVar5[5] = 0;
    auVar5[6] = uStack_685;
    auVar5[7] = 0;
    auVar5[9] = 0;
    auVar5[8] = bStack_684;
    auVar5[10] = uStack_683;
    auVar5[0xb] = 0;
    auVar5[0xc] = uStack_682;
    auVar5[0xd] = 0;
    auVar5[0xe] = uStack_681;
    auVar5[0xf] = 0;
    auVar11 = pshufb(auVar5,auVar4);
    local_1b8 = auVar11._0_2_;
    sStack_1b6 = auVar11._2_2_;
    sStack_1b4 = auVar11._4_2_;
    sStack_1b2 = auVar11._6_2_;
    sStack_1b0 = auVar11._8_2_;
    sStack_1ae = auVar11._10_2_;
    sStack_1ac = auVar11._12_2_;
    sStack_1aa = auVar11._14_2_;
    uVar7 = uVar6 + local_1b8 * 0xff + 0x80;
    uVar12 = uStack_596 * 0x1f + sStack_1b6 * 0xe1 + 0x80;
    uVar16 = uStack_594 * 0x3c + sStack_1b4 * 0xc4 + 0x80;
    uVar20 = uStack_592 * 0x56 + sStack_1b2 * 0xaa + 0x80;
    uVar24 = uVar6 * 0x6f + sStack_1b0 * 0x91 + 0x80;
    uVar28 = uStack_58e * 0x85 + sStack_1ae * 0x7b + 0x80;
    uVar32 = uStack_58c * 0x9a + sStack_1ac * 0x66 + 0x80;
    uVar36 = uStack_58a * 0xac + sStack_1aa * 0x54 + 0x80;
    uVar8 = uVar7 >> 8;
    uVar13 = uVar12 >> 8;
    uVar17 = uVar16 >> 8;
    uVar21 = uVar20 >> 8;
    uVar25 = uVar24 >> 8;
    uVar29 = uVar28 >> 8;
    uVar33 = uVar32 >> 8;
    uVar37 = uVar36 >> 8;
    uVar9 = uVar6 * 0xbc + local_1b8 * 0x44 + 0x80;
    uVar14 = uStack_596 * 0xca + sStack_1b6 * 0x36 + 0x80;
    uVar18 = uStack_594 * 0xd5 + sStack_1b4 * 0x2b + 0x80;
    uVar22 = uStack_5b2 * 0xdf + sStack_1b2 * 0x21 + 0x80;
    uVar26 = uVar6 * 0xe6 + sStack_1b0 * 0x1a + 0x80;
    uVar30 = uStack_58e * 0xec + sStack_1ae * 0x14 + 0x80;
    uVar34 = uStack_58c * 0xef + sStack_1ac * 0x11 + 0x80;
    uVar38 = uStack_5aa * 0xf0 + sStack_1aa * 0x10 + 0x80;
    uVar10 = uVar9 >> 8;
    uVar15 = uVar14 >> 8;
    uVar19 = uVar18 >> 8;
    uVar23 = uVar22 >> 8;
    uVar27 = uVar26 >> 8;
    uVar31 = uVar30 >> 8;
    uVar35 = uVar34 >> 8;
    uVar39 = uVar38 >> 8;
    *local_748 = CONCAT17((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37),
                          CONCAT16((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) -
                                   (0xff < uVar33),
                                   CONCAT15((uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar28 >> 8) -
                                            (0xff < uVar29),
                                            CONCAT14((uVar25 != 0) * (uVar25 < 0x100) *
                                                     (char)(uVar24 >> 8) - (0xff < uVar25),
                                                     CONCAT13((uVar21 != 0) * (uVar21 < 0x100) *
                                                              (char)(uVar20 >> 8) - (0xff < uVar21),
                                                              CONCAT12((uVar17 != 0) *
                                                                       (uVar17 < 0x100) *
                                                                       (char)(uVar16 >> 8) -
                                                                       (0xff < uVar17),
                                                                       CONCAT11((uVar13 != 0) *
                                                                                (uVar13 < 0x100) *
                                                                                (char)(uVar12 >> 8)
                                                                                - (0xff < uVar13),
                                                                                (uVar8 != 0) *
                                                                                (uVar8 < 0x100) *
                                                                                (char)(uVar7 >> 8) -
                                                                                (0xff < uVar8)))))))
                         );
    local_748[1] = CONCAT17((uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39)
                            ,CONCAT16((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) -
                                      (0xff < uVar35),
                                      CONCAT15((uVar31 != 0) * (uVar31 < 0x100) *
                                               (char)(uVar30 >> 8) - (0xff < uVar31),
                                               CONCAT14((uVar27 != 0) * (uVar27 < 0x100) *
                                                        (char)(uVar26 >> 8) - (0xff < uVar27),
                                                        CONCAT13((uVar23 != 0) * (uVar23 < 0x100) *
                                                                 (char)(uVar22 >> 8) -
                                                                 (0xff < uVar23),
                                                                 CONCAT12((uVar19 != 0) *
                                                                          (uVar19 < 0x100) *
                                                                          (char)(uVar18 >> 8) -
                                                                          (0xff < uVar19),
                                                                          CONCAT11((uVar15 != 0) *
                                                                                   (uVar15 < 0x100)
                                                                                   * (char)(uVar14 
                                                  >> 8) - (0xff < uVar15),
                                                  (uVar10 != 0) * (uVar10 < 0x100) *
                                                  (char)(uVar9 >> 8) - (0xff < uVar10))))))));
    local_748 = (undefined8 *)(in_RSI + (long)local_748);
  }
  uVar1 = in_RCX[1];
  local_6c8 = (byte)uVar1;
  uStack_6c7 = (undefined1)((ulong)uVar1 >> 8);
  uStack_6c6 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_6c5 = (undefined1)((ulong)uVar1 >> 0x18);
  bStack_6c4 = (byte)((ulong)uVar1 >> 0x20);
  uStack_6c3 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_6c2 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_6c1 = (undefined1)((ulong)uVar1 >> 0x38);
  for (local_84c = 0x1000100; local_84c < 0xf0e0f0f; local_84c = local_84c + 0x2020202) {
    auVar11._4_4_ = local_84c;
    auVar11._0_4_ = local_84c;
    auVar11._12_4_ = local_84c;
    auVar11._8_4_ = local_84c;
    auVar3[1] = 0;
    auVar3[0] = local_6c8;
    auVar3[2] = uStack_6c7;
    auVar3[3] = 0;
    auVar3[4] = uStack_6c6;
    auVar3[5] = 0;
    auVar3[6] = uStack_6c5;
    auVar3[7] = 0;
    auVar3[9] = 0;
    auVar3[8] = bStack_6c4;
    auVar3[10] = uStack_6c3;
    auVar3[0xb] = 0;
    auVar3[0xc] = uStack_6c2;
    auVar3[0xd] = 0;
    auVar3[0xe] = uStack_6c1;
    auVar3[0xf] = 0;
    auVar11 = pshufb(auVar3,auVar11);
    local_378 = auVar11._0_2_;
    sStack_376 = auVar11._2_2_;
    sStack_374 = auVar11._4_2_;
    sStack_372 = auVar11._6_2_;
    sStack_370 = auVar11._8_2_;
    sStack_36e = auVar11._10_2_;
    sStack_36c = auVar11._12_2_;
    sStack_36a = auVar11._14_2_;
    uVar7 = uVar6 + local_378 * 0xff + 0x80;
    uVar12 = uStack_596 * 0x1f + sStack_376 * 0xe1 + 0x80;
    uVar16 = uStack_594 * 0x3c + sStack_374 * 0xc4 + 0x80;
    uVar20 = uStack_592 * 0x56 + sStack_372 * 0xaa + 0x80;
    uVar24 = uVar6 * 0x6f + sStack_370 * 0x91 + 0x80;
    uVar28 = uStack_58e * 0x85 + sStack_36e * 0x7b + 0x80;
    uVar32 = uStack_58c * 0x9a + sStack_36c * 0x66 + 0x80;
    uVar36 = uStack_58a * 0xac + sStack_36a * 0x54 + 0x80;
    uVar8 = uVar7 >> 8;
    uVar13 = uVar12 >> 8;
    uVar17 = uVar16 >> 8;
    uVar21 = uVar20 >> 8;
    uVar25 = uVar24 >> 8;
    uVar29 = uVar28 >> 8;
    uVar33 = uVar32 >> 8;
    uVar37 = uVar36 >> 8;
    uVar9 = uVar6 * 0xbc + local_378 * 0x44 + 0x80;
    uVar14 = uStack_596 * 0xca + sStack_376 * 0x36 + 0x80;
    uVar18 = uStack_594 * 0xd5 + sStack_374 * 0x2b + 0x80;
    uVar22 = uStack_5b2 * 0xdf + sStack_372 * 0x21 + 0x80;
    uVar26 = uVar6 * 0xe6 + sStack_370 * 0x1a + 0x80;
    uVar30 = uStack_58e * 0xec + sStack_36e * 0x14 + 0x80;
    uVar34 = uStack_58c * 0xef + sStack_36c * 0x11 + 0x80;
    uVar38 = uStack_5aa * 0xf0 + sStack_36a * 0x10 + 0x80;
    uVar10 = uVar9 >> 8;
    uVar15 = uVar14 >> 8;
    uVar19 = uVar18 >> 8;
    uVar23 = uVar22 >> 8;
    uVar27 = uVar26 >> 8;
    uVar31 = uVar30 >> 8;
    uVar35 = uVar34 >> 8;
    uVar39 = uVar38 >> 8;
    *local_748 = CONCAT17((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37),
                          CONCAT16((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) -
                                   (0xff < uVar33),
                                   CONCAT15((uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar28 >> 8) -
                                            (0xff < uVar29),
                                            CONCAT14((uVar25 != 0) * (uVar25 < 0x100) *
                                                     (char)(uVar24 >> 8) - (0xff < uVar25),
                                                     CONCAT13((uVar21 != 0) * (uVar21 < 0x100) *
                                                              (char)(uVar20 >> 8) - (0xff < uVar21),
                                                              CONCAT12((uVar17 != 0) *
                                                                       (uVar17 < 0x100) *
                                                                       (char)(uVar16 >> 8) -
                                                                       (0xff < uVar17),
                                                                       CONCAT11((uVar13 != 0) *
                                                                                (uVar13 < 0x100) *
                                                                                (char)(uVar12 >> 8)
                                                                                - (0xff < uVar13),
                                                                                (uVar8 != 0) *
                                                                                (uVar8 < 0x100) *
                                                                                (char)(uVar7 >> 8) -
                                                                                (0xff < uVar8)))))))
                         );
    local_748[1] = CONCAT17((uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39)
                            ,CONCAT16((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) -
                                      (0xff < uVar35),
                                      CONCAT15((uVar31 != 0) * (uVar31 < 0x100) *
                                               (char)(uVar30 >> 8) - (0xff < uVar31),
                                               CONCAT14((uVar27 != 0) * (uVar27 < 0x100) *
                                                        (char)(uVar26 >> 8) - (0xff < uVar27),
                                                        CONCAT13((uVar23 != 0) * (uVar23 < 0x100) *
                                                                 (char)(uVar22 >> 8) -
                                                                 (0xff < uVar23),
                                                                 CONCAT12((uVar19 != 0) *
                                                                          (uVar19 < 0x100) *
                                                                          (char)(uVar18 >> 8) -
                                                                          (0xff < uVar19),
                                                                          CONCAT11((uVar15 != 0) *
                                                                                   (uVar15 < 0x100)
                                                                                   * (char)(uVar14 
                                                  >> 8) - (0xff < uVar15),
                                                  (uVar10 != 0) * (uVar10 < 0x100) *
                                                  (char)(uVar9 >> 8) - (0xff < uVar10))))))));
    local_748 = (undefined8 *)(in_RSI + (long)local_748);
  }
  return;
}

Assistant:

void aom_smooth_h_predictor_16x16_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[15]);
  const __m128i weights = LoadUnaligned16(smooth_weights + 12);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i weights1 = cvtepu8_epi16(weights);
  const __m128i weights2 = cvtepu8_epi16(_mm_srli_si128(weights, 8));
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i scaled_top_right1 =
      _mm_mullo_epi16(inverted_weights1, top_right);
  const __m128i scaled_top_right2 =
      _mm_mullo_epi16(inverted_weights2, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  __m128i left = cvtepu8_epi16(LoadLo8(left_column));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    dst += stride;
  }
  left = cvtepu8_epi16(LoadLo8(left_column + 8));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    dst += stride;
  }
}